

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayUtility.H
# Opt level: O0

void amrex::OverrideSync_finish<amrex::FArrayBox,void>(FabArray<amrex::FArrayBox> *fa)

{
  pointer pFVar1;
  type this;
  pointer in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  FabArray<amrex::FArrayBox> *in_stack_00000008;
  FabArray<amrex::FArrayBox> *in_stack_00000010;
  FabArrayBase *in_stack_ffffffffffffffd8;
  unique_ptr<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
  *in_stack_ffffffffffffffe0;
  uint local_14;
  pointer local_10;
  uint *puVar2;
  
  local_10 = in_RDI;
  local_14 = (uint)FabArrayBase::ixType(in_stack_ffffffffffffffd8);
  puVar2 = &local_14;
  if (local_14 != 0) {
    pFVar1 = std::
             unique_ptr<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
             ::operator->((unique_ptr<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
                           *)0xff2cae);
    FabArray<amrex::FArrayBox>::ParallelCopy_finish(pFVar1);
    pFVar1 = local_10;
    this = std::
           unique_ptr<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
           ::operator*(in_stack_ffffffffffffffe0);
    FabArrayBase::nComp(&local_10->super_FabArrayBase);
    Copy<amrex::FArrayBox,void>
              (in_stack_00000010,in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
               (int)((ulong)puVar2 >> 0x20),(int)puVar2);
    std::
    unique_ptr<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
    ::reset((unique_ptr<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
             *)this,pFVar1);
  }
  return;
}

Assistant:

void
OverrideSync_finish (FabArray<FAB> & fa)
{
    BL_PROFILE("OverrideSync_finish()");

    if (fa.ixType().cellCentered()) return;

    fa.os_temp->ParallelCopy_finish();
    amrex::Copy(fa, *(fa.os_temp), 0, 0, fa.nComp(), 0);

    fa.os_temp.reset();
}